

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O0

void zzRedCrand(word *a,word *mod,size_t n,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  word wVar4;
  ulong in_RDX;
  ulong *in_RSI;
  word *in_RDI;
  size_t i;
  word mask;
  dword prod;
  word carry;
  ulong local_48;
  ulong local_40;
  ulong local_28;
  
  wVar4 = zzAddMulW(in_RDI,in_RDI + in_RDX,in_RDX,-*in_RSI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = wVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = -*in_RSI;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *in_RDI;
  auVar3 = auVar1 * auVar2 + auVar3;
  local_28 = auVar3._8_8_;
  *in_RDI = auVar3._0_8_;
  local_40 = (ulong)(int)(uint)(*in_RSI <= *in_RDI);
  for (local_48 = 1; local_48 < in_RDX; local_48 = local_48 + 1) {
    in_RDI[local_48] = local_28 + in_RDI[local_48];
    local_28 = (ulong)(int)(uint)(in_RDI[local_48] < local_28);
    local_40 = (long)(int)(uint)(in_RSI[local_48] < in_RDI[local_48]) |
               (long)(int)(uint)(in_RSI[local_48] == in_RDI[local_48]) & local_40;
  }
  zzAddW2(in_RDI,in_RDX,-(local_40 | local_28) & -*in_RSI);
  return;
}

Assistant:

void SAFE(zzRedCrand)(word a[], const word mod[], size_t n, void* stack)
{
	register word carry;
	register dword prod;
	register word mask;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n >= 2 && mod[0] && wwIsRepW(mod + 1, n - 1, WORD_MAX));
	// iter1
	carry = zzAddMulW(a, a + n, n, WORD_0 - mod[0]);
	// iter2
	zzMul11(prod, carry, WORD_0 - mod[0]);
	prod += a[0];
	a[0] = (word)prod;
	prod >>= B_PER_W;
	// add and cmp
	carry = (word)prod;
	mask = wordLeq01(mod[0], a[0]);
	for (i = 1; i < n; ++i)
	{
		a[i] += carry;
		carry = wordLess01(a[i], carry);
		// mask <-  mod[i] < a[i] | mask & mod[i] == a[i];
		mask &= wordEq01(mod[i], a[i]);
		mask |= wordLess01(mod[i], a[i]);
	}
	// correct
	mask |= carry;
	mask = WORD_0 - mask;
	mask &= (WORD_0 - mod[0]);
	zzAddW2(a, n, mask);
	// очистка
	prod = 0;
	carry = mask = 0;
}